

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVProcessChain.cxx
# Opt level: O0

bool __thiscall cmUVProcessChain::InternalData::Finish(InternalData *this)

{
  bool bVar1;
  int iVar2;
  const_reference pvVar3;
  uv_stream_t *puVar4;
  uv_loop_t *ctx;
  uv_pipe_s *handle;
  int __oflag;
  int __oflag_00;
  undefined1 local_28 [8];
  uv_pipe_ptr tmpPipe;
  InternalData *this_local;
  
  tmpPipe.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
  super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  pvVar3 = std::array<cmUVProcessChainBuilder::StdioConfiguration,_3UL>::operator[]
                     (&this->Builder->Stdio,1);
  if (pvVar3->Type == Builtin) {
    puVar4 = ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_
                       (&(this->OutputStreamData).super_BasicStreamData.BuiltinStream);
    cmBasicUVStreambuf<char,_std::char_traits<char>_>::open
              ((cmBasicUVStreambuf<char,_std::char_traits<char>_> *)&this->OutputStreamData,
               (char *)puVar4,__oflag);
  }
  pvVar3 = std::array<cmUVProcessChainBuilder::StdioConfiguration,_3UL>::operator[]
                     (&this->Builder->Stdio,2);
  if (pvVar3->Type == Builtin) {
    ::cm::uv_pipe_ptr::uv_pipe_ptr((uv_pipe_ptr *)local_28);
    ctx = ::cm::uv_loop_ptr::operator_cast_to_uv_loop_s_(&this->Loop);
    iVar2 = ::cm::uv_pipe_ptr::init((uv_pipe_ptr *)local_28,(EVP_PKEY_CTX *)ctx);
    if (iVar2 < 0) {
      this_local._7_1_ = 0;
      bVar1 = true;
    }
    else {
      handle = ::cm::uv_handle_ptr_::operator_cast_to_uv_pipe_s_((uv_handle_ptr_ *)local_28);
      iVar2 = uv_pipe_open(handle,(this->ErrorStreamData).super_BasicStreamData.Stdio.data.fd);
      if (iVar2 < 0) {
        this_local._7_1_ = 0;
        bVar1 = true;
      }
      else {
        ::cm::uv_handle_ptr_base_<uv_pipe_s>::reset((uv_handle_ptr_base_<uv_pipe_s> *)local_28);
        puVar4 = ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_
                           (&(this->ErrorStreamData).super_BasicStreamData.BuiltinStream);
        cmBasicUVStreambuf<char,_std::char_traits<char>_>::open
                  ((cmBasicUVStreambuf<char,_std::char_traits<char>_> *)&this->ErrorStreamData,
                   (char *)puVar4,__oflag_00);
        bVar1 = false;
      }
    }
    ::cm::uv_pipe_ptr::~uv_pipe_ptr((uv_pipe_ptr *)local_28);
    if (bVar1) goto LAB_002e79ce;
  }
  this->Valid = true;
  this_local._7_1_ = 1;
LAB_002e79ce:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmUVProcessChain::InternalData::Finish()
{
  if (this->Builder->Stdio[cmUVProcessChainBuilder::Stream_OUTPUT].Type ==
      cmUVProcessChainBuilder::Builtin) {
    this->OutputStreamData.Streambuf.open(
      this->OutputStreamData.BuiltinStream);
  }

  if (this->Builder->Stdio[cmUVProcessChainBuilder::Stream_ERROR].Type ==
      cmUVProcessChainBuilder::Builtin) {
    cm::uv_pipe_ptr tmpPipe;
    if (tmpPipe.init(*this->Loop, 0) < 0) {
      return false;
    }
    if (uv_pipe_open(tmpPipe, this->ErrorStreamData.Stdio.data.fd) < 0) {
      return false;
    }
    tmpPipe.reset();

    this->ErrorStreamData.Streambuf.open(this->ErrorStreamData.BuiltinStream);
  }

  this->Valid = true;
  return true;
}